

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

bool_t strIsPrintable(char *str)

{
  byte bVar1;
  void *pvVar2;
  byte *pbVar3;
  
  bVar1 = *str;
  if (bVar1 != 0) {
    pbVar3 = (byte *)(str + 1);
    do {
      if ((((byte)(bVar1 - 0x3a) < 0xf6) && ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) &&
         (pvVar2 = memchr(" \'()+,-./:=?",(int)(char)bVar1,0xd), pvVar2 == (void *)0x0)) {
        return 0;
      }
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
  }
  return 1;
}

Assistant:

bool_t strIsPrintable(const char* str)
{
	ASSERT(strIsValid(str));
	for (; *str; ++str)
		if ((*str < '0' || *str > '9') &&
			(*str < 'A' || *str > 'Z') &&
			(*str < 'a' || *str > 'z') &&
			strchr(" '()+,-./:=?", *str) == 0)
			return FALSE;
	return TRUE;
}